

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O1

void __thiscall
module_level_txt_actions::module_start(module_level_txt_actions *this,string *module)

{
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    ",4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(module->_M_dataplus)._M_p,module->_M_string_length);
  if (0 < this->level_) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ->",3);
    return;
  }
  return;
}

Assistant:

void module_start( std::string const & module )
    {
        std::cout << "    " << module;

        if( level_ > 0 )
        {
            std::cout << " ->";
        }
    }